

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O3

void __thiscall
SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows4_Test::
~SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows4_Test
          (SemanticAnalyserTest_VariableAssignmentTypeMismatchThrows4_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableAssignmentTypeMismatchThrows4)
{
  std::string source = R"SRC(
  fn f(): f32
  {
    ret 12;
  }
  
  fn main(): f32
  {
    let x: function = \(x: f32): void = { };
    x = f();
    ret 0;
  }
  )SRC";
  throwTest(source);
}